

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<SSL_ECH_KEYS> __thiscall
bssl::anon_unknown_0::MakeTestECHKeys(anon_unknown_0 *this,uint8_t config_id)

{
  undefined1 config_id_00;
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *peVar3;
  EVP_HPKE_KEM *kem;
  SSL_ECH_KEYS *__p;
  pointer configs;
  unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> local_b8;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  size_t local_98;
  size_t ech_config_len;
  uint8_t *ech_config;
  ScopedEVP_HPKE_KEY key;
  uint8_t config_id_local;
  
  key.ctx_._111_1_ = config_id;
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&ech_config);
  peVar3 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&ech_config);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(peVar3,kem);
  config_id_00 = key.ctx_._111_1_;
  if (iVar2 != 0) {
    peVar3 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&ech_config);
    iVar2 = SSL_marshal_ech_config
                      ((uint8_t **)&ech_config_len,&local_98,config_id_00,peVar3,"public.example",
                       0x10);
    if (iVar2 != 0) {
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&keys,(pointer)ech_config_len)
      ;
      __p = SSL_ECH_KEYS_new();
      std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)&local_b8,__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b8);
      if (bVar1) {
        configs = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::get(&local_b8);
        peVar3 = internal::
                 StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                 ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                        *)&ech_config);
        iVar2 = SSL_ECH_KEYS_add(configs,1,(uint8_t *)ech_config_len,local_98,peVar3);
        if (iVar2 == 0) goto LAB_00188005;
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)this,&local_b8);
      }
      else {
LAB_00188005:
        std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&local_b8);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&keys);
      goto LAB_0018809a;
    }
  }
  std::unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ech_keys_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
LAB_0018809a:
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&ech_config);
  return (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_ECH_KEYS> MakeTestECHKeys(uint8_t config_id = 1) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len, config_id,
                              key.get(), "public.example", 16)) {
    return nullptr;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  // Install a non-retry config.
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return nullptr;
  }
  return keys;
}